

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::gt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  Literal *other_local;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == f32) {
    fVar2 = getf32(this);
    fVar3 = getf32(other);
    Literal(__return_storage_ptr__,(uint)(fVar3 < fVar2));
  }
  else {
    if (BVar1 != f64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x624);
    }
    dVar4 = getf64(this);
    dVar5 = getf64(other);
    Literal(__return_storage_ptr__,(uint)(dVar5 < dVar4));
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::gt(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(getf32() > other.getf32());
    case Type::f64:
      return Literal(getf64() > other.getf64());
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}